

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::startSpansLazily(BasicReporter *this)

{
  byte bVar1;
  bool bVar2;
  IConfig *pIVar3;
  ostream *poVar4;
  ulong uVar5;
  reference pSVar6;
  long in_RDI;
  SpanInfo *prevSpan;
  iterator itEnd;
  iterator it;
  SpanInfo *sectionSpan;
  ReporterConfig *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  ostream *in_stack_ffffffffffffff50;
  __normal_iterator<Catch::BasicReporter::SpanInfo_*,_std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>_>
  local_78;
  reference local_70;
  Ptr<Catch::IConfig> local_68;
  string local_60 [48];
  Ptr<Catch::IConfig> local_30;
  string local_28 [40];
  
  if ((*(byte *)(in_RDI + 0x48) & 1) == 0) {
    ReporterConfig::fullConfig(in_stack_ffffffffffffff38);
    pIVar3 = Ptr<Catch::IConfig>::operator->(&local_30);
    (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_28);
    bVar1 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_28);
    Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)in_stack_ffffffffffffff40);
    if ((bVar1 & 1) == 0) {
      poVar4 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      in_stack_ffffffffffffff50 = std::operator<<(poVar4,"[Started testing: ");
      ReporterConfig::fullConfig(in_stack_ffffffffffffff38);
      pIVar3 = Ptr<Catch::IConfig>::operator->(&local_68);
      (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_60);
      in_stack_ffffffffffffff40 = std::operator<<(in_stack_ffffffffffffff50,local_60);
      in_stack_ffffffffffffff38 = (ReporterConfig *)std::operator<<(in_stack_ffffffffffffff40,"]");
      std::ostream::operator<<(in_stack_ffffffffffffff38,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_60);
      Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)in_stack_ffffffffffffff40);
    }
    else {
      poVar4 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      poVar4 = std::operator<<(poVar4,"[Started testing]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    *(undefined1 *)(in_RDI + 0x48) = 1;
  }
  if (((*(byte *)(in_RDI + 0x70) & 1) == 0) &&
     (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
    poVar4 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    poVar4 = std::operator<<(poVar4,"[Started group: \'");
    poVar4 = std::operator<<(poVar4,(string *)(in_RDI + 0x50));
    poVar4 = std::operator<<(poVar4,"\']");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    *(undefined1 *)(in_RDI + 0x70) = 1;
  }
  if ((*(byte *)(in_RDI + 0x98) & 1) == 0) {
    poVar4 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"[Running: ");
    poVar4 = std::operator<<(poVar4,(string *)(in_RDI + 0x78));
    poVar4 = std::operator<<(poVar4,"]");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    *(undefined1 *)(in_RDI + 0x98) = 1;
  }
  bVar2 = std::
          vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
          empty((vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
                 *)in_stack_ffffffffffffff50);
  if (((!bVar2) &&
      (local_70 = std::
                  vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
                  ::back((vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
                          *)in_stack_ffffffffffffff40), (local_70->emitted & 1U) == 0)) &&
     (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
    if ((*(byte *)(in_RDI + 0x20) & 1) != 0) {
      poVar4 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      std::operator<<(poVar4,"\n");
      *(undefined1 *)(in_RDI + 0x20) = 0;
    }
    local_78._M_current =
         (SpanInfo *)
         std::
         vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
         begin((vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
                *)in_stack_ffffffffffffff38);
    std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
    end((vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_> *)
        in_stack_ffffffffffffff38);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<Catch::BasicReporter::SpanInfo_*,_std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>_>
                               *)in_stack_ffffffffffffff40,
                              (__normal_iterator<Catch::BasicReporter::SpanInfo_*,_std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>_>
                               *)in_stack_ffffffffffffff38), bVar2) {
      pSVar6 = __gnu_cxx::
               __normal_iterator<Catch::BasicReporter::SpanInfo_*,_std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>_>
               ::operator*(&local_78);
      if (((pSVar6->emitted & 1U) == 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)
         ) {
        poVar4 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
        poVar4 = std::operator<<(poVar4,"[Started section: \'");
        poVar4 = std::operator<<(poVar4,(string *)pSVar6);
        poVar4 = std::operator<<(poVar4,"\']");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pSVar6->emitted = true;
      }
      __gnu_cxx::
      __normal_iterator<Catch::BasicReporter::SpanInfo_*,_std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>_>
      ::operator++(&local_78);
    }
  }
  return;
}

Assistant:

void startSpansLazily() {
            if( !m_testingSpan.emitted ) {
                if( m_config.fullConfig()->name().empty() )
                    m_config.stream() << "[Started testing]" << std::endl;
                else
                    m_config.stream() << "[Started testing: " << m_config.fullConfig()->name() << "]" << std::endl;
                m_testingSpan.emitted = true;
            }

            if( !m_groupSpan.emitted && !m_groupSpan.name.empty() ) {
                m_config.stream() << "[Started group: '" << m_groupSpan.name << "']" << std::endl;
                m_groupSpan.emitted = true;
            }

            if( !m_testSpan.emitted ) {
                m_config.stream() << std::endl << "[Running: " << m_testSpan.name << "]" << std::endl;
                m_testSpan.emitted = true;
            }

            if( !m_sectionSpans.empty() ) {
                SpanInfo& sectionSpan = m_sectionSpans.back();
                if( !sectionSpan.emitted && !sectionSpan.name.empty() ) {
                    if( m_firstSectionInTestCase ) {
                        m_config.stream() << "\n";
                        m_firstSectionInTestCase = false;
                    }
                    std::vector<SpanInfo>::iterator it = m_sectionSpans.begin();
                    std::vector<SpanInfo>::iterator itEnd = m_sectionSpans.end();
                    for(; it != itEnd; ++it ) {
                        SpanInfo& prevSpan = *it;
                        if( !prevSpan.emitted && !prevSpan.name.empty() ) {
                            m_config.stream() << "[Started section: '" << prevSpan.name << "']" << std::endl;
                            prevSpan.emitted = true;
                        }
                    }
                }
            }
        }